

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O0

void buildXDBsortedAtomRecs(xformDatabase *xdb)

{
  xformAtomRecords **__base;
  int local_2c;
  int n;
  xformAtomRecords **srtvec;
  xformAtomRecords *xa;
  transformData *xform;
  xformDatabase *xdb_local;
  
  if (xdb != (xformDatabase *)0x0) {
    local_2c = 0;
    for (xa = (xformAtomRecords *)xdb->xforms; xa != (xformAtomRecords *)0x0; xa = xa->next) {
      for (srtvec = (xformAtomRecords **)xa->a; srtvec != (xformAtomRecords **)0x0;
          srtvec = &(*srtvec)->next) {
        local_2c = local_2c + 1;
      }
    }
    __base = (xformAtomRecords **)malloc((long)(local_2c + 1) << 3);
    if (__base == (xformAtomRecords **)0x0) {
      errmsg("could not create atom sorted-order array");
      xdb->sortedByRes = (xformAtomRecords **)0x0;
    }
    else {
      local_2c = 0;
      for (xa = (xformAtomRecords *)xdb->xforms; xa != (xformAtomRecords *)0x0; xa = xa->next) {
        for (srtvec = (xformAtomRecords **)xa->a; srtvec != (xformAtomRecords **)0x0;
            srtvec = &(*srtvec)->next) {
          __base[local_2c] = (xformAtomRecords *)srtvec;
          local_2c = local_2c + 1;
        }
      }
      __base[local_2c] = (xformAtomRecords *)0x0;
      qsort(__base,(long)local_2c,8,compareXDBAtomRecs);
      xdb->sortedByRes = __base;
    }
  }
  return;
}

Assistant:

void buildXDBsortedAtomRecs(xformDatabase* xdb) {
   transformData *xform = NULL;
   xformAtomRecords *xa = NULL;
   xformAtomRecords **srtvec = NULL;
   int n = 0;

   if (xdb) {
      n = 0; /* first count the number of atoms */
      for (xform = xdb->xforms; xform; xform = xform->next) {
	 for(xa = xform->recs; xa; xa = xa->next) {
	    n++;
	 }
      }

      /* build an array with extra room for a terminating null pointer */
      srtvec = (xformAtomRecords**)malloc((n + 1)*sizeof(xformAtomRecords*));
      if (!srtvec) {
	 errmsg("could not create atom sorted-order array");
	 xdb->sortedByRes = NULL;
	 return;
      }

      n = 0; /* now we store pointers to the AtomRecs in the array */
      for (xform = xdb->xforms; xform; xform = xform->next) {
	 for(xa = xform->recs; xa; xa = xa->next) {
	    srtvec[n] = xa;
	    n++;
	 }
      }
      srtvec[n] = NULL; /* array ends with a NULL */

      qsort(&(srtvec[0]), n, sizeof(xformAtomRecords*), compareXDBAtomRecs);

      xdb->sortedByRes = srtvec; /* stash away the sorted array */
   }
}